

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O3

Individual *
Individual::makeRandom(Individual *__return_storage_ptr__,shared_ptr<Instance> *instance)

{
  int iVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer piVar4;
  int iVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint uVar8;
  shared_ptr<Instance> local_30;
  
  local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pTVar2 = ((local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tasks).
           super__Vector_base<Task,_std::allocator<Task>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  pTVar3 = ((local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tasks).
           super__Vector_base<Task,_std::allocator<Task>_>._M_impl.super__Vector_impl_data._M_start;
  iVar1 = (local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->numProcessors;
  local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  uVar8 = (uint)((ulong)((long)pTVar2 - (long)pTVar3) >> 3);
  Individual(__return_storage_ptr__,&local_30,(long)(int)uVar8);
  if (local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (0 < (int)uVar8) {
    uVar7 = 0;
    do {
      iVar5 = rand();
      piVar4 = (__return_storage_ptr__->coresAsignedToTasks).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((ulong)((long)(__return_storage_ptr__->coresAsignedToTasks).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar4 >> 2) <= uVar7) {
        uVar6 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar7);
        if (local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_30.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        _Unwind_Resume(uVar6);
      }
      piVar4[uVar7] = iVar5 % iVar1;
      uVar7 = uVar7 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

Individual Individual::makeRandom(std::shared_ptr<Instance> instance){
	int numberOfTasks = instance->getNumTasks();
	int numerOfCores = instance->getNumProcessors();
	Individual outcome(instance, numberOfTasks);
	for(int i = 0; i < numberOfTasks; i++){
		int randomCore = rand() % numerOfCores;
		outcome.coresAsignedToTasks.at(i) = randomCore;
	}
	return outcome;
}